

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_append_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  undefined4 uVar2;
  vm_val_t *this_00;
  size_t sVar3;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmNativeCodeDesc *in_RDI;
  vm_val_t ele;
  int i;
  int add_cnt;
  int cnt;
  vm_val_t *valp;
  CVmObjVector *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  vm_obj_id_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int idx;
  
  if ((getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_append_all::desc,1);
    __cxa_guard_release(&getp_append_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (uint *)in_stack_ffffffffffffffa0,in_RDI);
  if (iVar1 == 0) {
    this_00 = CVmStack::get(0);
    vm_val_t::set_obj(in_RDX,in_ESI);
    CVmStack::push(in_RDX);
    sVar3 = get_element_count((CVmObjVector *)0x34cf9f);
    uVar2 = (undefined4)sVar3;
    iVar1 = vm_val_t::ll_length((vm_val_t *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    expand_by((CVmObjVector *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              in_stack_ffffffffffffffac,(size_t)in_stack_ffffffffffffffa0);
    for (idx = 1; idx <= iVar1; idx = idx + 1) {
      vm_val_t::ll_index(this_00,(vm_val_t *)CONCAT44(uVar2,iVar1),idx);
      set_element(in_stack_ffffffffffffffa0,(size_t)in_RDI,(vm_val_t *)0x34d004);
    }
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_append_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to append, but leave it on the stack */
    vm_val_t *valp = G_stk->get(0);

    /* the result object is 'self' */
    retval->set_obj(self);

    /* push a self-reference for gc protection */
    G_stk->push(retval);

    /* get the old size */
    int cnt = get_element_count();

    /* get the number of items to add */
    int add_cnt = valp->ll_length(vmg0_);

    /* expand myself to make room for the new elements */
    expand_by(vmg_ self, add_cnt);

    /* add the new elements */
    for (int i = 1 ; i <= add_cnt ; ++i)
    {
        /* get the next new element */
        vm_val_t ele;
        valp->ll_index(vmg_ &ele, i);
        
        /* 
         *   add the new element - note that we don't need to keep undo
         *   because we created this new element in this same operation, and
         *   hence undoing the operation will truncate the vector to exclude
         *   the element, and hence we don't need an old value for the
         *   element 
         */
        set_element(cnt + i - 1, &ele);
    }

    /* discard the argument and gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}